

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O3

void __thiscall HModel::correctDual(HModel *this,int *freeInfeasCount)

{
  double dVar1;
  double dVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  uint uVar11;
  int iVar12;
  vector<double,_std::allocator<double>_> *pvVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  double dVar17;
  
  iVar12 = this->numTot;
  if (iVar12 < 1) {
    iVar15 = 0;
  }
  else {
    dVar1 = this->dblOption[2];
    piVar4 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->nonbasicMove).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->workLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->workUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->workDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar9 = (this->workCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->workValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar16 = 0;
    iVar15 = 0;
    do {
      if (piVar4[lVar16] != 0) {
        dVar17 = pdVar6[lVar16];
        if ((((dVar17 != -1e+200) || (NAN(dVar17))) || (dVar2 = pdVar7[lVar16], dVar2 != 1e+200)) ||
           (NAN(dVar2))) {
          iVar3 = piVar5[lVar16];
          dVar2 = pdVar8[lVar16];
          if ((double)iVar3 * dVar2 <= -dVar1) {
            if (((dVar17 == -1e+200) && (!NAN(dVar17))) ||
               ((dVar17 = pdVar7[lVar16], dVar17 == 1e+200 && (!NAN(dVar17))))) {
              this->problemPerturbed = 1;
              uVar11 = (this->random).random_mw;
              uVar14 = (this->random).random_mz;
              uVar14 = (uVar14 >> 0x10) + (uVar14 & 0xffff) * 0x9069;
              uVar11 = (uVar11 >> 0x10) + (uVar11 & 0xffff) * 18000;
              iVar3 = piVar5[lVar16];
              (this->random).random_mz = uVar14;
              (this->random).random_mw = uVar11;
              dVar17 = ((double)(uVar14 * 0x10000 + uVar11) + 1.0) * 2.328306435454494e-10 + 1.0;
              if (iVar3 != 1) {
                dVar17 = -dVar17;
              }
              pdVar8[lVar16] = dVar17 * dVar1;
              pdVar9[lVar16] = (dVar17 * dVar1 - dVar2) + pdVar9[lVar16];
            }
            else {
              piVar5[lVar16] = -iVar3;
              pvVar13 = &this->workUpper;
              if (iVar3 == -1) {
                pvVar13 = &this->workLower;
              }
              pdVar10[lVar16] =
                   (pvVar13->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar16];
              iVar12 = this->numTot;
            }
          }
        }
        else {
          iVar15 = (iVar15 + 1) - (uint)(ABS(pdVar8[lVar16]) < dVar1);
        }
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar12);
  }
  *freeInfeasCount = iVar15;
  return;
}

Assistant:

void HModel::correctDual(int *freeInfeasCount) {
  const double tau_d = dblOption[DBLOPT_DUAL_TOL];
  const double inf = HSOL_CONST_INF;
  int workCount = 0;
  for (int i = 0; i < numTot; i++) {
    if (nonbasicFlag[i]) {
      if (workLower[i] == -inf && workUpper[i] == inf) {
	// FREE variable
	workCount += (fabs(workDual[i]) >= tau_d);
      } else if (nonbasicMove[i] * workDual[i] <= -tau_d) {
	if (workLower[i] != -inf && workUpper[i] != inf) {
	  // Boxed variable = flip
	  flipBound(i);
	} else {
	  // Other variable = shift
	  problemPerturbed = 1;
	  if (nonbasicMove[i] == 1) {
	    double dual = (1 + random.dblRandom()) * tau_d;
	    double shift = dual - workDual[i];
	    workDual[i] = dual;
	    workCost[i] = workCost[i] + shift;
	  } else {
	    double dual = -(1 + random.dblRandom()) * tau_d;
	    double shift = dual - workDual[i];
	    workDual[i] = dual;
	    workCost[i] = workCost[i] + shift;
	  }
	}
      }
    }
  }
  
  *freeInfeasCount = workCount;
}